

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O0

void __thiscall DNSResolve::SendRequest(DNSResolve *this,string *hostname,DNS_TYPE type)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  uint16_t uVar4;
  Log *pLVar5;
  char *dot_str;
  size_t sVar6;
  reference to;
  sockaddr_in *dns_server_addr;
  iterator __end1;
  iterator __begin1;
  list<sockaddr_in,_std::allocator<sockaddr_in>_> *__range1;
  size_t dns_packet_size;
  size_t encode_domain_name_len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char *local_48;
  char *encode_domain_name;
  size_t domain_name_len;
  uint16_t qclass;
  DNSHeader *pDStack_30;
  uint16_t qtype;
  DNSHeader *dns_header;
  char *write_dns_packet_ptr;
  string *psStack_18;
  DNS_TYPE type_local;
  string *hostname_local;
  DNSResolve *this_local;
  
  dns_header = (DNSHeader *)this->dns_packet_;
  write_dns_packet_ptr._4_4_ = type;
  psStack_18 = hostname;
  hostname_local = (string *)this;
  memset(dns_header,0,
         (ulong)this->kMaxDownmainNameLen + 0xc + (ulong)this->kDnsTypeSize +
         (ulong)this->kDnsClassSzie);
  pDStack_30 = dns_header;
  dns_header->trans_id = 0;
  uVar4 = htons(0x100);
  pDStack_30->flags = uVar4;
  uVar4 = htons(1);
  pDStack_30->question_count = uVar4;
  pDStack_30->answer_count = 0;
  pDStack_30->authority_count = 0;
  pDStack_30->additional_count = 0;
  domain_name_len._6_2_ = htons(1);
  domain_name_len._4_2_ = htons(1);
  encode_domain_name = (char *)std::__cxx11::string::length();
  local_48 = (char *)operator_new__((ulong)(encode_domain_name + 2));
  if (local_48 == (char *)0x0) {
    pLVar5 = Log::GetInstance();
    pLVar5 = Log::operator<<(pLVar5,red);
    Log::FormatTime_abi_cxx11_();
    pLVar5 = Log::operator<<(pLVar5,&local_68);
    pLVar5 = Log::operator<<(pLVar5,(char (*) [10])" [error] ");
    Log::operator<<(pLVar5,(char (*) [15])"malloc failed\n");
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    dot_str = (char *)std::__cxx11::string::c_str();
    bVar3 = EncodeDotStr(this,dot_str,local_48,(size_t)(encode_domain_name + 2));
    if (bVar3) {
      sVar6 = strlen(local_48);
      dns_header = dns_header + 1;
      memcpy(dns_header,local_48,sVar6 + 1);
      dns_header = (DNSHeader *)((long)&dns_header->trans_id + sVar6 + 1);
      memcpy(dns_header,(void *)((long)&domain_name_len + 6),(ulong)this->kDnsTypeSize);
      dns_header = (DNSHeader *)((long)&dns_header->trans_id + (long)(int)(uint)this->kDnsTypeSize);
      memcpy(dns_header,(void *)((long)&domain_name_len + 4),(ulong)this->kDnsClassSzie);
      if (local_48 != (char *)0x0) {
        operator_delete(local_48);
      }
      uVar1 = this->kDnsTypeSize;
      uVar2 = this->kDnsClassSzie;
      __end1 = std::__cxx11::list<sockaddr_in,_std::allocator<sockaddr_in>_>::begin(&this->servers_)
      ;
      dns_server_addr =
           (sockaddr_in *)
           std::__cxx11::list<sockaddr_in,_std::allocator<sockaddr_in>_>::end(&this->servers_);
      while (bVar3 = std::operator!=(&__end1,(_Self *)&dns_server_addr), bVar3) {
        to = std::_List_iterator<sockaddr_in>::operator*(&__end1);
        BufferSendTo(this->dns_socket_,this->dns_packet_,
                     (int)sVar6 + 0xd + (uint)uVar1 + (uint)uVar2,(sockaddr *)to,0x10);
        std::_List_iterator<sockaddr_in>::operator++(&__end1);
      }
    }
    else {
      pLVar5 = Log::GetInstance();
      pLVar5 = Log::operator<<(pLVar5,red);
      Log::FormatTime_abi_cxx11_();
      pLVar5 = Log::operator<<(pLVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&encode_domain_name_len);
      pLVar5 = Log::operator<<(pLVar5,(char (*) [10])" [error] ");
      Log::operator<<(pLVar5,(char (*) [21])"EncodeDotStr Failed\n");
      std::__cxx11::string::~string((string *)&encode_domain_name_len);
      if (local_48 != (char *)0x0) {
        operator_delete(local_48);
      }
    }
  }
  return;
}

Assistant:

void DNSResolve::SendRequest(const string& hostname, DNS_TYPE type)
{
    char *write_dns_packet_ptr = dns_packet_;
    memset(write_dns_packet_ptr, 0, kDnsPacketMaxSize);

    //fill dns request header
    DNSHeader *dns_header = (DNSHeader*)write_dns_packet_ptr;
    dns_header->trans_id = 0;
    dns_header->flags = htons(0x0100);
    dns_header->question_count = htons(0x0001);
    dns_header->answer_count = 0x0000;
    dns_header->authority_count = 0x0000;
    dns_header->additional_count = 0x0000;

    //set dns request packet
    uint16_t qtype = htons(0x0001);
    uint16_t qclass = htons(0x0001);
    size_t domain_name_len = hostname.length();
    char *encode_domain_name = new char[domain_name_len + 2];
    if (encode_domain_name == NULL)
    {
        LOGE << "malloc failed\n";
        return;
    }
    if (!EncodeDotStr(hostname.c_str(), encode_domain_name, domain_name_len + 2))
    {
        LOGE << "EncodeDotStr Failed\n";
        delete encode_domain_name;
        return;
    }

    //fill dns request packet
    size_t encode_domain_name_len = strlen(encode_domain_name) + 1;
    memcpy(write_dns_packet_ptr += sizeof(DNSHeader), encode_domain_name, encode_domain_name_len);
    memcpy(write_dns_packet_ptr += encode_domain_name_len, (char*)(&qtype), kDnsTypeSize);
    memcpy(write_dns_packet_ptr += kDnsTypeSize, (char*)(&qclass), kDnsClassSzie);
    delete encode_domain_name;

    size_t dns_packet_size = sizeof(DNSHeader) + encode_domain_name_len + kDnsTypeSize + kDnsClassSzie;
    for (auto& dns_server_addr : servers_)
    {
        BufferSendTo(dns_socket_, dns_packet_, dns_packet_size, (sockaddr*)&dns_server_addr, sizeof(dns_server_addr));
    }
}